

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gillespie.cpp
# Opt level: O0

void __thiscall Gillespie::UpdatePropensity(Gillespie *this,Ptr *reaction)

{
  __normal_iterator<std::shared_ptr<Reaction>_*,_std::vector<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>_>
  _Var1;
  bool bVar2;
  element_type *peVar3;
  iterator __first;
  size_type __n;
  reference pvVar4;
  runtime_error *this_00;
  shared_ptr<Reaction> *extraout_XMM0_Qa;
  difference_type index;
  shared_ptr<Reaction> *local_38;
  __normal_iterator<std::shared_ptr<Reaction>_*,_std::vector<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>_>
  local_30;
  __normal_iterator<std::shared_ptr<Reaction>_*,_std::vector<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>_>
  local_28;
  __normal_iterator<std::shared_ptr<Reaction>_*,_std::vector<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>_>
  it;
  double alpha_diff;
  Ptr *reaction_local;
  Gillespie *this_local;
  
  peVar3 = std::__shared_ptr_access<Reaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Reaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      reaction);
  (**peVar3->_vptr_Reaction)();
  it._M_current = extraout_XMM0_Qa;
  local_30._M_current =
       (shared_ptr<Reaction> *)
       std::vector<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>::begin
                 (&this->reactions_);
  local_38 = (shared_ptr<Reaction> *)
             std::vector<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>::
             end(&this->reactions_);
  local_28 = std::
             find<__gnu_cxx::__normal_iterator<std::shared_ptr<Reaction>*,std::vector<std::shared_ptr<Reaction>,std::allocator<std::shared_ptr<Reaction>>>>,std::shared_ptr<Reaction>>
                       (local_30,(__normal_iterator<std::shared_ptr<Reaction>_*,_std::vector<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>_>
                                  )local_38,reaction);
  index = (difference_type)
          std::vector<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>::end
                    (&this->reactions_);
  bVar2 = __gnu_cxx::operator!=
                    (&local_28,
                     (__normal_iterator<std::shared_ptr<Reaction>_*,_std::vector<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>_>
                      *)&index);
  if (bVar2) {
    __first = std::vector<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>::
              begin(&this->reactions_);
    __n = std::
          distance<__gnu_cxx::__normal_iterator<std::shared_ptr<Reaction>*,std::vector<std::shared_ptr<Reaction>,std::allocator<std::shared_ptr<Reaction>>>>>
                    ((__normal_iterator<std::shared_ptr<Reaction>_*,_std::vector<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>_>
                      )__first._M_current,local_28);
    _Var1 = it;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&this->alpha_list_,__n);
    *pvVar4 = (double)_Var1._M_current + *pvVar4;
  }
  else if ((this->initialized_ & 1U) == 1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"Attempting to update propensity of invalid reaction.");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this->alpha_sum_ = (double)it._M_current + this->alpha_sum_;
  return;
}

Assistant:

void Gillespie::UpdatePropensity(Reaction::Ptr reaction) {
  // if (index >= reactions_.size() || index >= alpha_list_.size() || index < 0)
  // {
  //  throw std::range_error(
  //      "Gillespie: Reaction index out of range for propensity update.");
  // }
  // double new_prop = reactions_[index]->CalculatePropensity();
  // double diff = new_prop - alpha_list_[index];
  // alpha_sum_ += diff;
  // alpha_list_[index] = new_prop;
  double alpha_diff = reaction->CalculatePropensity();
  auto it = std::find(reactions_.begin(), reactions_.end(), reaction);
  if (it != reactions_.end()) {
    auto index = std::distance(reactions_.begin(), it);
    alpha_list_[index] += alpha_diff;
  } else {
    // Don't throw an error unless everything has been initialized
    if (initialized_ == true) {
      throw std::runtime_error(
          "Attempting to update propensity of invalid reaction.");
    }
  }
  alpha_sum_ += alpha_diff;
}